

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_step(lua_State *L)

{
  global_State *g;
  global_State *pgVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  lu_mem lVar5;
  GCObject **ppGVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  GCObject **old;
  long lVar12;
  GCObject *dummy;
  GCObject *local_38;
  
  g = L->l_G;
  if (g->gcstp == '\0') {
    if ((g->gckind == '\x01') || (g->lastatomic != 0)) {
      uVar10 = g->lastatomic;
      if (uVar10 != 0) {
        if (g->gckind == '\x01') {
          enterinc(g);
        }
        luaC_runtilstate(L,1);
        lVar5 = atomic(L);
        if ((uVar10 >> 3) + uVar10 <= lVar5) {
          g->GCestimate = g->GCdebt + g->totalbytes;
          pgVar1 = L->l_G;
          pgVar1->gcstate = '\x03';
          ppGVar6 = &pgVar1->allgc;
          do {
            ppGVar6 = sweeplist(L,ppGVar6,1,(int *)0x0);
          } while (ppGVar6 == &pgVar1->allgc);
          pgVar1->sweepgc = ppGVar6;
          luaC_runtilstate(L,0x100);
          uVar7 = (ulong)g->gcpause * 4;
          uVar10 = g->GCestimate / 100;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar10;
          lVar8 = uVar10 * uVar7;
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar3,0) <= uVar7) {
            lVar8 = 0x7fffffffffffffff;
          }
          uVar10 = (g->GCdebt + g->totalbytes) - lVar8;
          luaE_setdebt(g,(long)uVar10 >> 0x3f & uVar10);
          g->lastatomic = lVar5;
          return;
        }
        atomic2gen(L,g);
        uVar10 = -((ulong)g->genminormul * ((ulong)(g->GCdebt + g->totalbytes) / 100));
        goto LAB_00142893;
      }
      uVar7 = g->GCestimate;
      if ((g->GCdebt < 1) ||
         (uVar11 = (ulong)g->genmajormul * (uVar7 / 100) * 4,
         (ulong)(g->GCdebt + g->totalbytes) <= uVar11 + uVar7)) {
        if (g->firstold1 != (GCObject *)0x0) {
          markold(g,g->firstold1,g->reallyold);
          g->firstold1 = (GCObject *)0x0;
        }
        markold(g,g->finobj,g->finobjrold);
        markold(g,g->tobefnz,(GCObject *)0x0);
        atomic(L);
        g->gcstate = '\x03';
        ppGVar6 = sweepgen(L,g,&g->allgc,g->survival,&g->firstold1);
        sweepgen(L,g,ppGVar6,g->old1,&g->firstold1);
        g->reallyold = g->old1;
        g->old1 = *ppGVar6;
        g->survival = g->allgc;
        local_38 = (GCObject *)0x0;
        ppGVar6 = sweepgen(L,g,&g->finobj,g->finobjsur,&local_38);
        sweepgen(L,g,ppGVar6,g->finobjold1,&local_38);
        g->finobjrold = g->finobjold1;
        g->finobjold1 = *ppGVar6;
        g->finobjsur = g->finobj;
        sweepgen(L,g,&g->tobefnz,(GCObject *)0x0,&local_38);
        finishgencycle(L,g);
        luaE_setdebt(g,-((ulong)g->genminormul * ((ulong)(g->GCdebt + g->totalbytes) / 100)));
        g->GCestimate = uVar7;
        return;
      }
      enterinc(g);
      lVar5 = entergen(L,g);
      uVar10 = g->GCdebt + g->totalbytes;
      if (uVar10 < (uVar11 >> 1) + uVar7) {
        return;
      }
      g->lastatomic = lVar5;
      uVar11 = (ulong)g->gcpause * 4;
      uVar7 = g->GCestimate / 100;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      lVar8 = uVar7 * uVar11;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar2,0) <= uVar11) {
        lVar8 = 0x7fffffffffffffff;
      }
      uVar10 = uVar10 - lVar8;
    }
    else {
      lVar8 = (ulong)g->gcstepmul * 4 + 1;
      lVar12 = ((ulong)g->GCdebt >> 4) * lVar8;
      lVar9 = ((ulong)(1L << (g->gcstepsize & 0x3f)) >> 4) * lVar8;
      if (0x3e < g->gcstepsize) {
        lVar9 = 0x7fffffffffffffff;
      }
      do {
        lVar5 = singlestep(L);
        lVar12 = lVar12 - lVar5;
        if (lVar12 == -lVar9 || SBORROW8(lVar12,-lVar9) != lVar12 + lVar9 < 0) break;
      } while (g->gcstate != '\b');
      if (g->gcstate != '\b') {
        uVar10 = lVar12 / lVar8 << 4;
        goto LAB_00142893;
      }
      uVar7 = (ulong)g->gcpause * 4;
      uVar10 = g->GCestimate / 100;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar10;
      lVar8 = 0x7fffffffffffffff;
      if (uVar7 < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar4,0)) {
        lVar8 = uVar10 * uVar7;
      }
      uVar10 = (g->GCdebt + g->totalbytes) - lVar8;
    }
    uVar10 = (long)uVar10 >> 0x3f & uVar10;
  }
  else {
    uVar10 = 0xfffffffffffff830;
  }
LAB_00142893:
  luaE_setdebt(g,uVar10);
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  if (!gcrunning(g))  /* not running? */
    luaE_setdebt(g, -2000);
  else {
    if(isdecGCmodegen(g))
      genstep(L, g);
    else
      incstep(L, g);
  }
}